

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

int __thiscall piksel::Image::loadBase64(Image *this,string *encoded)

{
  int iVar1;
  stbi_uc *data;
  string decoded;
  string local_38;
  
  stbi_set_flip_vertically_on_load(1);
  base64_decode(&local_38,encoded);
  data = stbi_load_from_memory
                   ((stbi_uc *)local_38._M_dataplus._M_p,(int)local_38._M_string_length,&this->width
                    ,&this->height,(int *)0x0,4);
  iVar1 = _load(this,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int Image::loadBase64(std::string encoded) {
	stbi_set_flip_vertically_on_load(1);
	std::string decoded = base64_decode(encoded);
	unsigned char* data = stbi_load_from_memory(reinterpret_cast<const unsigned char *>(decoded.c_str()), decoded.length(), &width, &height, NULL, 4);
	return _load(data);
}